

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateSettings(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->SettingsLoaded & 1U) == 0) {
    bVar2 = ImChunkStream<ImGuiWindowSettings>::empty(&GImGui->SettingsWindows);
    if (!bVar2) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x2c47,"void ImGui::UpdateSettings()");
    }
    if ((pIVar1->IO).IniFilename != (char *)0x0) {
      LoadIniSettingsFromDisk((pIVar1->IO).IniFilename);
    }
    pIVar1->SettingsLoaded = true;
  }
  if ((0.0 < pIVar1->SettingsDirtyTimer) &&
     (pIVar1->SettingsDirtyTimer = pIVar1->SettingsDirtyTimer - (pIVar1->IO).DeltaTime,
     pIVar1->SettingsDirtyTimer <= 0.0)) {
    if ((pIVar1->IO).IniFilename == (char *)0x0) {
      (pIVar1->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk((pIVar1->IO).IniFilename);
    }
    pIVar1->SettingsDirtyTimer = 0.0;
  }
  return;
}

Assistant:

void ImGui::UpdateSettings()
{
    // Load settings on first frame (if not explicitly loaded manually before)
    ImGuiContext& g = *GImGui;
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }
}